

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-ieee.h
# Opt level: O1

DiyFp __thiscall icu_63::double_conversion::Double::AsNormalizedDiyFp(Double *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint64_t d64;
  int iVar5;
  DiyFp DVar6;
  
  uVar1 = this->d64_;
  uVar4 = uVar1 & 0xfffffffffffff;
  iVar5 = ((uint)(uVar1 >> 0x34) & 0x7ff) - 0x433;
  lVar3 = uVar4 + 0x10000000000000;
  if ((uVar1 & 0x7ff0000000000000) == 0) {
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    lVar3 = uVar4 << (~(byte)lVar2 + 0x35 & 0x3f);
    iVar5 = -0x427 - ((uint)lVar2 ^ 0x3f);
  }
  DVar6.f_ = lVar3 << 0xb;
  DVar6.e_ = iVar5 + -0xb;
  DVar6._12_4_ = 0;
  return DVar6;
}

Assistant:

uint64_t AsUint64() const {
    return d64_;
  }